

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* __thiscall
args::NamedBase::GetDescription_abi_cxx11_
          (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           *__return_storage_ptr__,NamedBase *this,HelpParams *params,uint indentLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  description;
  undefined1 local_140 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Head_base<2UL,_unsigned_int,_false> local_f8;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  pointer local_a0 [2];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_90;
  undefined1 local_88 [32];
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  paVar1 = &local_f0.field_2;
  local_f8._M_head_impl = 0;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  delimiter = &local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  local_d0 = delimiter;
  (*(this->super_Base)._vptr_Base[0x11])(local_140);
  std::__cxx11::string::operator=((string *)&local_d0,(string *)local_140);
  if ((undefined1 *)CONCAT44(local_140._4_4_,local_140._0_4_) != local_140 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_140._4_4_,local_140._0_4_),local_140._16_8_ + 1);
  }
  std::__cxx11::string::_M_assign((string *)&local_f0);
  bVar2 = this->choicesStringManual;
  local_b0._M_allocated_capacity = (size_type)local_a0;
  local_f8._M_head_impl = indentLevel;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,", ","");
  local_90 = __return_storage_ptr__;
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_140,(detail *)&this->choicesStrings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_b0,(string *)delimiter);
  bVar3 = params->addChoices;
  (*(this->super_Base)._vptr_Base[0x10])(&local_48,this,params);
  local_88._0_8_ = (pointer)(local_88 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,", ","");
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_68,(detail *)&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88,(string *)delimiter);
  AddDescriptionPostfix
            (this,&local_f0,bVar2,(string *)local_140,bVar3,&local_68,&params->choiceString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_88._16_8_)->_M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((undefined1 *)CONCAT44(local_140._4_4_,local_140._0_4_) != local_140 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_140._4_4_,local_140._0_4_),local_140._16_8_ + 1);
  }
  if ((pointer *)local_b0._M_allocated_capacity != local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity,
                    (ulong)((long)&(local_a0[0]->_M_dataplus)._M_p + 1));
  }
  bVar2 = this->defaultStringManual;
  bVar3 = params->addDefault;
  (*(this->super_Base)._vptr_Base[0xf])(local_140,this,params);
  AddDescriptionPostfix
            (this,&local_f0,bVar2,&this->defaultString,bVar3,(string *)local_140,
             &params->defaultString);
  this_00 = local_90;
  if ((undefined1 *)CONCAT44(local_140._4_4_,local_140._0_4_) != local_140 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_140._4_4_,local_140._0_4_),local_140._16_8_ + 1);
  }
  local_140._0_4_ = local_f8._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar1) {
    local_128._8_8_ = local_f0.field_2._8_8_;
    local_140._8_8_ = &local_128;
  }
  else {
    local_140._8_8_ = local_f0._M_dataplus._M_p;
  }
  local_128._M_allocated_capacity._1_7_ = local_f0.field_2._M_allocated_capacity._1_7_;
  local_128._M_local_buf[0] = local_f0.field_2._M_local_buf[0];
  local_140._16_8_ = local_f0._M_string_length;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  if (local_d0 == &local_c0) {
    local_108._8_8_ = local_c0._8_8_;
    local_118._M_p = (pointer)&local_108;
  }
  else {
    local_118._M_p = (pointer)local_d0;
  }
  local_108._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_108._M_local_buf[0] = local_c0._M_local_buf[0];
  local_110 = local_c8;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_140;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  local_d0 = &local_c0;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(this_00,__l,(allocator_type *)local_b0._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._8_8_ != &local_128) {
    operator_delete((void *)local_140._8_8_,local_128._0_8_ + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return this_00;
}

Assistant:

virtual std::vector<std::tuple<std::string, std::string, unsigned>> GetDescription(const HelpParams &params, const unsigned indentLevel) const override
            {
                std::tuple<std::string, std::string, unsigned> description;
                std::get<0>(description) = GetNameString(params);
                std::get<1>(description) = help;
                std::get<2>(description) = indentLevel;

                AddDescriptionPostfix(std::get<1>(description), choicesStringManual, detail::Join(choicesStrings, ", "), params.addChoices, detail::Join(GetChoicesStrings(params), ", "), params.choiceString);
                AddDescriptionPostfix(std::get<1>(description), defaultStringManual, defaultString, params.addDefault, GetDefaultString(params), params.defaultString);

                return { std::move(description) };
            }